

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void more(void)

{
  wchar_t wVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  if (skip_more == '\0') {
    draw_msgwin();
    bVar6 = settings.standout != '\0';
    if ((msgwin == (WINDOW *)0x0) || (msgwin->_maxy != 0)) {
      newline();
      draw_msgwin();
      iVar3 = -2;
      iVar4 = -2;
      if (msgwin != (WINDOW *)0x0) {
        iVar4 = (int)msgwin->_maxy;
      }
      wmove(msgwin,iVar4,0);
      wclrtoeol(msgwin);
      if (msgwin != (WINDOW *)0x0) {
        iVar3 = (int)msgwin->_maxy;
      }
      uVar2 = 0x24;
    }
    else {
      uVar2 = 0x48;
      iVar3 = 0;
    }
    wmove(msgwin,iVar3,uVar2);
    wattr_on(msgwin,(ulong)bVar6 << 0x10,0);
    iVar3 = -1;
    waddnstr(msgwin,"--More--",0xffffffff);
    wattr_off(msgwin,(ulong)bVar6 << 0x10,0);
    wrefresh(msgwin);
    iVar4 = -1;
    if (msgwin != (WINDOW *)0x0) {
      iVar3 = (int)msgwin->_cury;
      iVar4 = (int)msgwin->_curx;
    }
    do {
      do {
        wVar1 = nh_wgetch(msgwin);
        draw_map(player.x,player.y);
        wmove(msgwin,iVar3,iVar4);
        doupdate();
      } while (0x20 < (uint)wVar1);
    } while ((0x108002400U >> ((ulong)(uint)wVar1 & 0x3f) & 1) == 0);
    uVar5 = 0xfffffffffffffffe;
    if ((msgwin == (WINDOW *)0x0) ||
       (uVar5 = (ulong)(uint)(int)msgwin->_maxy, (int)msgwin->_maxy != 0)) {
      wmove(msgwin,uVar5,0);
      wclrtoeol(msgwin);
    }
    else {
      newline();
    }
    draw_msgwin();
    if (wVar1 == L'\x1b') {
      skip_more = '\x01';
    }
    last_redraw_curline = curline;
  }
  return;
}

Assistant:

static void more(void)
{
    int key;
    int cursx, cursy;
    attr_t attr = A_NORMAL;

    if (skip_more)
	return;

    draw_msgwin();

    if (settings.standout)
	attr = A_STANDOUT;

    if (getmaxy(msgwin) == 1) {
	wmove(msgwin, getmaxy(msgwin)-1, COLNO-8);
	wattron(msgwin, attr);
	waddstr(msgwin, "--More--");
	wattroff(msgwin, attr);
	wrefresh(msgwin);
    } else {
	newline();
	draw_msgwin();
	wmove(msgwin, getmaxy(msgwin)-1, 0);
	wclrtoeol(msgwin);
	wmove(msgwin, getmaxy(msgwin)-1, COLNO/2 - 4);
	wattron(msgwin, attr);
	waddstr(msgwin, "--More--");
	wattroff(msgwin, attr);
	wrefresh(msgwin);
    }

    getyx(msgwin, cursy, cursx);
    do {
	key = nh_wgetch(msgwin);
	draw_map(player.x, player.y);
	wmove(msgwin, cursy, cursx);
	doupdate();
    } while (key != '\n' && key != '\r' && key != ' ' && key != KEY_ESC);

    /* Clean up after the --More--. */
    if (getmaxy(msgwin) == 1) {
	newline();
    } else {
	wmove(msgwin, getmaxy(msgwin)-1, 0);
	wclrtoeol(msgwin);
    }
    draw_msgwin();

    if (key == KEY_ESC)
	skip_more = TRUE;

    /* we want to --more-- by screenfuls, not lines */
    last_redraw_curline = curline;
}